

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
std::experimental::optional<const_Command_*>::optional
          (optional<const_Command_*> *this,optional<const_Command_*> *rhs)

{
  bool bVar1;
  Command **ppCVar2;
  Command **ppCVar3;
  optional<const_Command_*> *rhs_local;
  optional<const_Command_*> *this_local;
  
  constexpr_optional_base<const_Command_*>::constexpr_optional_base
            (&this->super_OptionalBase<const_Command_*>);
  bVar1 = initialized(rhs);
  if (bVar1) {
    ppCVar2 = dataptr(this);
    ppCVar3 = operator*(rhs);
    *ppCVar2 = *ppCVar3;
    (this->super_OptionalBase<const_Command_*>).init_ = true;
  }
  return;
}

Assistant:

optional(optional&& rhs) noexcept(is_nothrow_move_constructible<T>::value)
  : OptionalBase<T>()
  {
    if (rhs.initialized()) {
        ::new (static_cast<void*>(dataptr())) T(std::move(*rhs));
        OptionalBase<T>::init_ = true;
    }
  }